

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

node_t find_maximum(flags_map_t *f)

{
  int iVar1;
  int iVar2;
  pointer pvVar3;
  long lVar4;
  node_t nVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  pvVar3 = (f->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar6 = 0;
  iVar7 = 0;
  for (lVar8 = 0;
      lVar8 != ((long)(f->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
      lVar8 = lVar8 + 1) {
    lVar4 = *(long *)&pvVar3[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    for (lVar9 = 0;
        (long)*(pointer *)
               ((long)&pvVar3[lVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8) - lVar4 >> 2 != lVar9; lVar9 = lVar9 + 1) {
      iVar2 = *(int *)(lVar4 + lVar9 * 4);
      iVar1 = *(int *)(*(long *)&pvVar3[iVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data + (long)iVar7 * 4);
      if (iVar1 < iVar2) {
        iVar6 = (int)lVar8;
      }
      if (iVar1 < iVar2) {
        iVar7 = (int)lVar9;
      }
    }
  }
  nVar5.second = iVar7;
  nVar5.first = iVar6;
  return nVar5;
}

Assistant:

node_t find_maximum(const flags_map_t f)
{
    node_t result(0, 0);
    for (size_t i = 0; i < f.size(); i++)
    {
        for (size_t j = 0; j < f[i].size(); j++)
        {
            if (f[i][j] > f[result.first][result.second])
            {
                result = node_t(i, j);
            }
        }
    }

    return result;
}